

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Observer.cc
# Opt level: O2

CoordTopocentric * __thiscall
libsgp4::Observer::GetLookAngle(CoordTopocentric *__return_storage_ptr__,Observer *this,Eci *eci)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  ulong uVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  DateTime local_28;
  
  local_28.m_encoded = (eci->m_dt).m_encoded;
  Update(this,&local_28);
  dVar1 = (eci->m_velocity).x;
  dVar2 = (eci->m_velocity).y;
  dVar3 = (this->m_eci).m_velocity.x;
  dVar4 = (this->m_eci).m_velocity.y;
  dVar5 = (eci->m_velocity).z;
  dVar6 = (this->m_eci).m_velocity.z;
  dVar15 = (eci->m_position).x - (this->m_eci).m_position.x;
  dVar8 = (eci->m_position).y - (this->m_eci).m_position.y;
  dVar16 = (eci->m_position).z - (this->m_eci).m_position.z;
  dVar9 = SQRT(dVar16 * dVar16 + dVar15 * dVar15 + dVar8 * dVar8);
  local_28.m_encoded = (eci->m_dt).m_encoded;
  dVar10 = DateTime::ToLocalMeanSiderealTime(&local_28,(this->m_geo).longitude);
  dVar11 = sin((this->m_geo).latitude);
  dVar12 = cos((this->m_geo).latitude);
  dVar13 = sin(dVar10);
  dVar10 = cos(dVar10);
  dVar17 = (dVar11 * dVar10 * dVar15 + dVar11 * dVar13 * dVar8) - dVar12 * dVar16;
  dVar14 = atan(-(dVar8 * dVar10 - dVar13 * dVar15) / dVar17);
  uVar7 = -(ulong)(0.0 < dVar17);
  dVar14 = (double)(uVar7 & (ulong)(dVar14 + 3.141592653589793) | ~uVar7 & (ulong)dVar14);
  dVar10 = asin((dVar11 * dVar16 + dVar10 * dVar12 * dVar15 + dVar12 * dVar13 * dVar8) / dVar9);
  __return_storage_ptr__->azimuth =
       (double)(~-(ulong)(dVar14 < 0.0) & (ulong)dVar14 |
               (ulong)(dVar14 + 6.283185307179586) & -(ulong)(dVar14 < 0.0));
  __return_storage_ptr__->elevation = dVar10;
  __return_storage_ptr__->range = dVar9;
  __return_storage_ptr__->range_rate =
       (dVar16 * (dVar5 - dVar6) + dVar15 * (dVar1 - dVar3) + dVar8 * (dVar2 - dVar4)) / dVar9;
  return __return_storage_ptr__;
}

Assistant:

CoordTopocentric Observer::GetLookAngle(const Eci &eci)
{
    /*
     * update the observers Eci to match the time of the Eci passed in
     * if necessary
     */
    Update(eci.GetDateTime());

    /*
     * calculate differences
     */
    Vector range_rate = eci.Velocity() - m_eci.Velocity();
    Vector range = eci.Position() - m_eci.Position();

    range.w = range.Magnitude();

    /*
     * Calculate Local Mean Sidereal Time for observers longitude
     */
    double theta = eci.GetDateTime().ToLocalMeanSiderealTime(m_geo.longitude);

    double sin_lat = sin(m_geo.latitude);
    double cos_lat = cos(m_geo.latitude);
    double sin_theta = sin(theta);
    double cos_theta = cos(theta);

    double top_s = sin_lat * cos_theta * range.x
        + sin_lat * sin_theta * range.y - cos_lat * range.z;
    double top_e = -sin_theta * range.x
        + cos_theta * range.y;
    double top_z = cos_lat * cos_theta * range.x 
        + cos_lat * sin_theta * range.y + sin_lat * range.z;
    double az = atan(-top_e / top_s);

    if (top_s > 0.0)
    {
        az += kPI;
    }

    if (az < 0.0)
    {
        az += 2.0 * kPI;
    }

    double el = asin(top_z / range.w);
    double rate = range.Dot(range_rate) / range.w;

    /*
     * azimuth in radians
     * elevation in radians
     * range in km
     * range rate in km/s
     */
    return CoordTopocentric(az,
            el,
            range.w,
            rate);
}